

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O1

void secp256k1_fe_inv_var(secp256k1_fe *r,secp256k1_fe *x)

{
  secp256k1_scalar *r_00;
  uint uVar1;
  int iVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  ulong uVar5;
  secp256k1_gej *psVar6;
  secp256k1_gej *psVar7;
  byte bVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  secp256k1_scalar *a;
  int iVar17;
  secp256k1_fe *psVar18;
  secp256k1_sha256 *psVar19;
  secp256k1_gej *psVar20;
  secp256k1_gej *psVar21;
  ulong uVar22;
  undefined8 *puVar23;
  secp256k1_sha256 *psVar24;
  secp256k1_sha256 *a_00;
  secp256k1_fe *psVar25;
  secp256k1_fe *psVar26;
  secp256k1_fe *psVar27;
  secp256k1_gej *r_01;
  uint64_t *puVar28;
  secp256k1_sha256 *psVar29;
  uint64_t *puVar30;
  secp256k1_gej *psVar31;
  int iVar32;
  secp256k1_gej *psVar33;
  ulong uVar34;
  secp256k1_gej *psVar35;
  ulong uVar36;
  secp256k1_sha256 *psVar37;
  secp256k1_sha256 *psVar38;
  secp256k1_gej *psVar39;
  bool bVar40;
  byte bVar41;
  secp256k1_fe tmp;
  secp256k1_fe sStack_11b0;
  undefined1 auStack_1180 [144];
  undefined1 auStack_10f0 [112];
  secp256k1_ge sStack_1080;
  secp256k1_fe asStack_fe8 [31];
  secp256k1_ge sStack_a00;
  secp256k1_fe asStack_968 [31];
  secp256k1_sha256 *psStack_378;
  secp256k1_gej *psStack_370;
  ulong uStack_368;
  secp256k1_sha256 *psStack_360;
  secp256k1_gej *psStack_358;
  secp256k1_gej *psStack_350;
  undefined8 uStack_340;
  undefined1 auStack_338 [48];
  ulong uStack_308;
  secp256k1_sha256 *psStack_300;
  undefined1 auStack_2f8 [40];
  secp256k1_modinv64_trans2x2 sStack_2d0;
  secp256k1_sha256 *psStack_2b0;
  secp256k1_gej *psStack_2a8;
  ulong uStack_2a0;
  secp256k1_sha256 *psStack_298;
  secp256k1_gej *psStack_290;
  secp256k1_gej *psStack_288;
  undefined1 auStack_280 [56];
  ulong uStack_248;
  ulong uStack_240;
  uint64_t uStack_238;
  uint64_t uStack_230;
  int iStack_228;
  int iStack_224;
  secp256k1_modinv64_signed62 sStack_220;
  secp256k1_fe sStack_1f8;
  secp256k1_fe *psStack_1c8;
  secp256k1_sha256 *psStack_1c0;
  undefined1 auStack_1b8 [48];
  undefined1 auStack_188 [192];
  ulong uStack_c8;
  secp256k1_fe *psStack_c0;
  secp256k1_fe *psStack_b8;
  secp256k1_modinv64_signed62 *psStack_b0;
  long local_a0;
  ulong local_98;
  secp256k1_modinv64_signed62 local_90;
  secp256k1_fe local_68;
  
  bVar41 = 0;
  psStack_b0 = (secp256k1_modinv64_signed62 *)0x1494aa;
  secp256k1_fe_verify(x);
  local_a0 = 0x1000003d1;
  uVar10 = (x->n[4] >> 0x30) * 0x1000003d1 + x->n[0];
  uVar36 = (uVar10 >> 0x34) + x->n[1];
  uVar14 = (uVar36 >> 0x34) + x->n[2];
  uVar15 = (uVar14 >> 0x34) + x->n[3];
  local_98 = (uVar15 >> 0x34) + (x->n[4] & 0xffffffffffff);
  psVar20 = (secp256k1_gej *)
            ((uVar10 ^ 0x1000003d0) & uVar36 & uVar14 & uVar15 & (local_98 ^ 0xf000000000000));
  psStack_b0 = (secp256k1_modinv64_signed62 *)0x149547;
  secp256k1_fe_verify(x);
  local_68.n[0] = x->n[0];
  local_68.n[1] = x->n[1];
  local_68.n[2] = x->n[2];
  local_68.n[3] = x->n[3];
  local_68.n[4] = x->n[4];
  local_68.magnitude = x->magnitude;
  local_68.normalized = x->normalized;
  psStack_b0 = (secp256k1_modinv64_signed62 *)0x149570;
  secp256k1_fe_normalize_var(&local_68);
  local_90.v[0] = (local_68.n[1] << 0x34 | local_68.n[0]) & 0x3fffffffffffffff;
  local_90.v[1] = (ulong)((uint)local_68.n[2] & 0xfffff) << 0x2a | local_68.n[1] >> 10;
  local_90.v[2] = (ulong)((uint)local_68.n[3] & 0x3fffffff) << 0x20 | local_68.n[2] >> 0x14;
  local_90.v[3] = (local_68.n[4] & 0xffffffffff) << 0x16 | local_68.n[3] >> 0x1e;
  local_90.v[4] = local_68.n[4] >> 0x28;
  psStack_b0 = (secp256k1_modinv64_signed62 *)0x149602;
  secp256k1_modinv64_var(&local_90,&secp256k1_const_modinfo_fe);
  psStack_b0 = (secp256k1_modinv64_signed62 *)0x14960d;
  secp256k1_fe_from_signed62(r,&local_90);
  r->magnitude = (uint)(0 < x->magnitude);
  r->normalized = 1;
  psStack_b0 = (secp256k1_modinv64_signed62 *)0x149629;
  secp256k1_fe_verify(r);
  psVar25 = (secp256k1_fe *)(r->n[4] & 0xffffffffffff);
  uVar11 = (r->n[4] >> 0x30) * local_a0 + r->n[0];
  uVar5 = (uVar11 >> 0x34) + r->n[1];
  uVar16 = (uVar5 >> 0x34) + r->n[2];
  uVar22 = (uVar16 >> 0x34) + r->n[3];
  puVar23 = (undefined8 *)((long)psVar25->n + (uVar22 >> 0x34));
  uVar34 = (uVar11 ^ 0x1000003d0) & uVar5 & uVar16 & uVar22 & ((ulong)puVar23 ^ 0xf000000000000);
  uVar10 = (uVar36 | uVar10 | uVar14 | uVar15) & 0xfffffffffffff | local_98;
  if ((psVar20 != (secp256k1_gej *)0xfffffffffffff && uVar10 != 0) !=
      (uVar34 == 0xfffffffffffff ||
      ((uVar5 | uVar11 | uVar16 | uVar22) & 0xfffffffffffff) == 0 && puVar23 == (undefined8 *)0x0))
  {
    secp256k1_fe_verify(r);
    return;
  }
  psStack_b0 = (secp256k1_modinv64_signed62 *)secp256k1_ellswift_prng;
  secp256k1_fe_inv_var_cold_1();
  psVar24 = (secp256k1_sha256 *)(auStack_188 + 0x60);
  psVar37 = psVar24;
  psStack_c0 = r;
  psStack_b8 = x;
  psStack_b0 = &local_90;
  for (lVar12 = 0xd; lVar12 != 0; lVar12 = lVar12 + -1) {
    *(undefined8 *)psVar37->s = *puVar23;
    puVar23 = puVar23 + (ulong)bVar41 * -2 + 1;
    psVar37 = (secp256k1_sha256 *)((long)psVar37 + (ulong)bVar41 * -0x10 + 8);
  }
  uVar5 = uStack_c8 >> 6;
  auStack_188._80_8_ = 0x149719;
  secp256k1_sha256_write(psVar24,auStack_188 + 0x5c,4);
  auStack_188._80_8_ = 0x149724;
  psVar18 = psVar25;
  psVar37 = psVar24;
  secp256k1_sha256_finalize(psVar24,(uchar *)psVar25);
  uVar5 = uVar5 + 1;
  if (uStack_c8 >> 6 == uVar5) {
    return;
  }
  auStack_188._80_8_ = secp256k1_ge_x_frac_on_curve_var;
  secp256k1_ellswift_prng_cold_1();
  psVar19 = (secp256k1_sha256 *)auStack_1b8;
  psVar26 = (secp256k1_fe *)auStack_1b8;
  psVar27 = (secp256k1_fe *)auStack_1b8;
  psVar39 = (secp256k1_gej *)0xfffffffffffff;
  psStack_1c0 = (secp256k1_sha256 *)0x149770;
  auStack_188._56_8_ = psVar25;
  auStack_188._64_8_ = uVar34;
  auStack_188._72_8_ = psVar24;
  auStack_188._80_8_ = uVar5;
  secp256k1_fe_verify(psVar18);
  uVar5 = (psVar18->n[4] >> 0x30) * 0x1000003d1 + psVar18->n[0];
  if (((uVar5 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar5 & 0xfffffffffffff) == 0)) {
    uVar11 = (uVar5 >> 0x34) + psVar18->n[1];
    psVar24 = (secp256k1_sha256 *)((uVar11 >> 0x34) + psVar18->n[2]);
    psVar25 = (secp256k1_fe *)(((ulong)psVar24 >> 0x34) + psVar18->n[3]);
    uVar14 = ((ulong)psVar25 >> 0x34) + (psVar18->n[4] & 0xffffffffffff);
    psVar35 = (secp256k1_gej *)0x1000003d0;
    if ((((uVar11 | uVar5 | (ulong)psVar24 | (ulong)psVar25) & 0xfffffffffffff) == 0 && uVar14 == 0)
       || (((uVar5 | 0x1000003d0) & uVar11 & (ulong)psVar24 & (ulong)psVar25 &
           (uVar14 ^ 0xf000000000000)) == 0xfffffffffffff)) goto LAB_00149968;
  }
  psVar39 = (secp256k1_gej *)auStack_188;
  psStack_1c0 = (secp256k1_sha256 *)0x149829;
  secp256k1_fe_mul((secp256k1_fe *)psVar39,psVar18,(secp256k1_fe *)psVar37);
  psStack_1c0 = (secp256k1_sha256 *)0x149837;
  secp256k1_fe_sqr((secp256k1_fe *)auStack_1b8,(secp256k1_fe *)psVar37);
  psStack_1c0 = (secp256k1_sha256 *)0x149845;
  secp256k1_fe_mul((secp256k1_fe *)psVar39,(secp256k1_fe *)psVar39,(secp256k1_fe *)auStack_1b8);
  psStack_1c0 = (secp256k1_sha256 *)0x149850;
  secp256k1_fe_sqr((secp256k1_fe *)auStack_1b8,psVar18);
  psStack_1c0 = (secp256k1_sha256 *)0x14985b;
  secp256k1_fe_sqr((secp256k1_fe *)auStack_1b8,(secp256k1_fe *)auStack_1b8);
  psStack_1c0 = (secp256k1_sha256 *)0x149863;
  secp256k1_fe_verify((secp256k1_fe *)auStack_1b8);
  if ((int)auStack_1b8._40_4_ < 5) {
    auStack_1b8._40_4_ = auStack_1b8._40_4_ * 7;
    psVar24 = (secp256k1_sha256 *)(auStack_1b8._0_8_ * 7);
    auStack_1b8._8_8_ = auStack_1b8._8_8_ * 7;
    auStack_1b8._16_8_ = auStack_1b8._16_8_ * 7;
    auStack_1b8._24_8_ = auStack_1b8._24_8_ * 7;
    auStack_1b8._32_8_ = auStack_1b8._32_8_ * 7;
    auStack_1b8._44_4_ = 0;
    psStack_1c0 = (secp256k1_sha256 *)0x1498ec;
    auStack_1b8._0_8_ = psVar24;
    secp256k1_fe_verify((secp256k1_fe *)auStack_1b8);
    psVar37 = (secp256k1_sha256 *)auStack_188;
    psStack_1c0 = (secp256k1_sha256 *)0x1498f9;
    secp256k1_fe_verify((secp256k1_fe *)psVar37);
    psStack_1c0 = (secp256k1_sha256 *)0x149901;
    secp256k1_fe_verify((secp256k1_fe *)auStack_1b8);
    auStack_188._40_4_ = auStack_1b8._40_4_ + auStack_188._40_4_;
    psVar18 = (secp256k1_fe *)auStack_1b8;
    psVar25 = psVar27;
    if ((int)auStack_188._40_4_ < 0x21) {
      auStack_188._0_8_ = (long)(uint32_t *)auStack_1b8._0_8_ + auStack_188._0_8_;
      auStack_188._8_8_ = auStack_188._8_8_ + auStack_1b8._8_8_;
      auStack_188._16_8_ = auStack_188._16_8_ + auStack_1b8._16_8_;
      auStack_188._24_8_ = auStack_188._24_8_ + auStack_1b8._24_8_;
      auStack_188._32_8_ = auStack_188._32_8_ + auStack_1b8._32_8_;
      auStack_188._44_4_ = 0;
      psStack_1c0 = (secp256k1_sha256 *)0x14994a;
      secp256k1_fe_verify((secp256k1_fe *)auStack_188);
      psStack_1c0 = (secp256k1_sha256 *)0x149952;
      secp256k1_fe_is_square_var((secp256k1_fe *)auStack_188);
      return;
    }
  }
  else {
    psStack_1c0 = (secp256k1_sha256 *)0x149963;
    secp256k1_ge_x_frac_on_curve_var_cold_3();
    psVar24 = psVar19;
    psVar25 = psVar26;
  }
  psStack_1c0 = (secp256k1_sha256 *)0x149968;
  secp256k1_ge_x_frac_on_curve_var_cold_2();
  psVar35 = (secp256k1_gej *)auStack_1b8;
LAB_00149968:
  psStack_1c0 = (secp256k1_sha256 *)secp256k1_fe_is_square_var;
  secp256k1_ge_x_frac_on_curve_var_cold_1();
  psStack_1c0 = psVar37;
  psStack_1c8 = psVar18;
  r_01 = (secp256k1_gej *)auStack_280;
  psVar6 = (secp256k1_gej *)auStack_280;
  psVar19 = (secp256k1_sha256 *)auStack_280;
  auStack_280._48_8_ = psVar25->n[0];
  uStack_248 = psVar25->n[1];
  uStack_240 = psVar25->n[2];
  uStack_238 = psVar25->n[3];
  uStack_230 = psVar25->n[4];
  iStack_228 = psVar25->magnitude;
  iStack_224 = psVar25->normalized;
  psStack_288 = (secp256k1_gej *)0x149999;
  secp256k1_fe_verify(psVar25);
  auStack_280._0_8_ = psVar25->n[0];
  auStack_280._8_8_ = psVar25->n[1];
  auStack_280._16_8_ = psVar25->n[2];
  auStack_280._24_8_ = psVar25->n[3];
  auStack_280._32_8_ = psVar25->n[4];
  auStack_280._40_8_ = *(undefined8 *)&psVar25->magnitude;
  psStack_288 = (secp256k1_gej *)0x1499ba;
  secp256k1_fe_normalize_var((secp256k1_fe *)auStack_280);
  psStack_288 = (secp256k1_gej *)0x1499c2;
  secp256k1_fe_verify((secp256k1_fe *)auStack_280);
  if (auStack_280._44_4_ == 0) {
    psStack_288 = (secp256k1_gej *)0x149b5b;
    secp256k1_fe_is_square_var_cold_2();
  }
  else {
    if (((auStack_280._16_8_ == 0 && auStack_280._24_8_ == 0) &&
        (auStack_280._8_8_ == 0 && auStack_280._0_8_ == 0)) && auStack_280._32_8_ == 0) {
      psVar19 = (secp256k1_sha256 *)0x1;
    }
    else {
      sStack_220.v[0] = (auStack_280._8_8_ << 0x34 | auStack_280._0_8_) & 0x3fffffffffffffff;
      sStack_220.v[1] =
           (ulong)((uint)auStack_280._16_8_ & 0xfffff) << 0x2a | (ulong)auStack_280._8_8_ >> 10;
      sStack_220.v[2] =
           (ulong)((uint)auStack_280._24_8_ & 0x3fffffff) << 0x20 |
           (ulong)auStack_280._16_8_ >> 0x14;
      sStack_220.v[3] =
           (auStack_280._32_8_ & 0xffffffffff) << 0x16 | (ulong)auStack_280._24_8_ >> 0x1e;
      sStack_220.v[4] = (ulong)auStack_280._32_8_ >> 0x28;
      psStack_288 = (secp256k1_gej *)0x149a7d;
      uVar1 = secp256k1_jacobi64_maybe_var(&sStack_220,&secp256k1_const_modinfo_fe);
      if (uVar1 == 0) {
        psStack_288 = (secp256k1_gej *)0x149aa1;
        uVar1 = secp256k1_fe_sqrt(&sStack_1f8,(secp256k1_fe *)auStack_280);
        psVar19 = (secp256k1_sha256 *)(ulong)uVar1;
      }
      else {
        psVar19 = (secp256k1_sha256 *)(ulong)(~uVar1 >> 0x1f);
      }
    }
    psVar37 = (secp256k1_sha256 *)(auStack_280 + 0x30);
    psStack_288 = (secp256k1_gej *)0x149ab0;
    secp256k1_fe_verify((secp256k1_fe *)psVar37);
    auStack_280._48_8_ = (uStack_230 >> 0x30) * 0x1000003d1 + auStack_280._48_8_;
    uStack_248 = ((ulong)auStack_280._48_8_ >> 0x34) + uStack_248;
    uStack_240 = (uStack_248 >> 0x34) + uStack_240;
    uVar5 = (uStack_240 >> 0x34) + uStack_238;
    uStack_238 = uVar5 & 0xfffffffffffff;
    uStack_230 = (uVar5 >> 0x34) + (uStack_230 & 0xffffffffffff);
    uStack_240 = uStack_240 & 0xfffffffffffff;
    uStack_248 = uStack_248 & 0xfffffffffffff;
    auStack_280._48_8_ = auStack_280._48_8_ & 0xfffffffffffff;
    iStack_228 = 1;
    psStack_288 = (secp256k1_gej *)0x149b3a;
    secp256k1_fe_verify((secp256k1_fe *)psVar37);
    psStack_288 = (secp256k1_gej *)0x149b45;
    psVar24 = psVar37;
    iVar2 = secp256k1_fe_sqrt((secp256k1_fe *)auStack_280,(secp256k1_fe *)psVar37);
    r_01 = psVar6;
    if ((int)psVar19 == iVar2) {
      return;
    }
  }
  psStack_288 = (secp256k1_gej *)secp256k1_jacobi64_maybe_var;
  secp256k1_fe_is_square_var_cold_1();
  psStack_288 = psVar20;
  psStack_290 = psVar39;
  psStack_298 = psVar37;
  uStack_2a0 = uVar10;
  psStack_2a8 = psVar35;
  psStack_2b0 = psVar19;
  auStack_2f8._32_8_ = *(uint64_t *)psVar24->buf;
  auStack_2f8._16_8_ = *(uint64_t *)(psVar24->s + 4);
  auStack_2f8._24_8_ = *(uint64_t *)(psVar24->s + 6);
  auStack_2f8._0_8_ = *(ulong *)psVar24->s;
  auStack_2f8._8_8_ = *(uint64_t *)(psVar24->s + 2);
  auStack_338._0_8_ = (r_01->x).n[0];
  auStack_338._8_8_ = (r_01->x).n[1];
  auStack_338._16_8_ = (r_01->x).n[2];
  auStack_338._24_8_ = (r_01->x).n[3];
  auStack_338._32_8_ = (r_01->x).n[4];
  a_00 = psVar24;
  if (((((long)auStack_338._0_8_ < 0) || ((long)auStack_338._8_8_ < 0)) ||
      (psVar19 = psVar24, a_00 = (secp256k1_sha256 *)auStack_338._16_8_,
      (long)auStack_338._16_8_ < 0)) ||
     ((r_01 = (secp256k1_gej *)auStack_338._24_8_, (long)auStack_338._24_8_ < 0 ||
      ((long)auStack_338._32_8_ < 0)))) {
LAB_00149fe3:
    psStack_350 = (secp256k1_gej *)0x149fe8;
    secp256k1_jacobi64_maybe_var_cold_18();
LAB_00149fe8:
    psStack_350 = (secp256k1_gej *)0x149fed;
    secp256k1_jacobi64_maybe_var_cold_11();
LAB_00149fed:
    psStack_350 = (secp256k1_gej *)0x149ff2;
    secp256k1_jacobi64_maybe_var_cold_10();
LAB_00149ff2:
    psStack_350 = (secp256k1_gej *)0x149ff7;
    secp256k1_jacobi64_maybe_var_cold_9();
LAB_00149ff7:
    psStack_350 = (secp256k1_gej *)0x149ffc;
    secp256k1_jacobi64_maybe_var_cold_8();
    psVar24 = psVar19;
    psVar38 = psVar37;
  }
  else {
    a_00 = (secp256k1_sha256 *)
           (auStack_338._16_8_ | auStack_338._24_8_ | auStack_338._8_8_ | auStack_338._0_8_ |
           auStack_338._32_8_);
    psVar38 = psVar37;
    if (a_00 != (secp256k1_sha256 *)0x0) {
      psVar37 = (secp256k1_sha256 *)0x5;
      uVar10 = 0xffffffffffffffff;
      uStack_308 = 0;
      psVar20 = (secp256k1_gej *)0x0;
      auStack_338._40_8_ = psVar24;
      do {
        psVar19 = (secp256k1_sha256 *)auStack_338._40_8_;
        r_01 = (secp256k1_gej *)(auStack_2f8._8_8_ << 0x3e | auStack_2f8._0_8_);
        puVar28 = (uint64_t *)(auStack_338._8_8_ << 0x3e | auStack_338._0_8_);
        psVar6 = (secp256k1_gej *)0x0;
        psVar29 = (secp256k1_sha256 *)0x0;
        psVar35 = (secp256k1_gej *)0x1;
        iVar2 = 0x3e;
        psVar38 = (secp256k1_sha256 *)0x1;
        puVar30 = puVar28;
        psVar33 = r_01;
        while( true ) {
          uVar5 = -1L << ((byte)iVar2 & 0x3f) | (ulong)puVar30;
          lVar12 = 0;
          if (uVar5 != 0) {
            for (; (uVar5 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
            }
          }
          bVar8 = (byte)lVar12;
          psVar31 = (secp256k1_gej *)((ulong)puVar30 >> (bVar8 & 0x3f));
          psVar38 = (secp256k1_sha256 *)((long)psVar38 << (bVar8 & 0x3f));
          psVar6 = (secp256k1_gej *)((long)psVar6 << (bVar8 & 0x3f));
          uVar10 = uVar10 - lVar12;
          a_00 = (secp256k1_sha256 *)((ulong)psVar33 >> 2);
          uVar1 = ((uint)((ulong)psVar33 >> 1) ^ (uint)a_00) & (uint)lVar12 ^ (uint)psVar20;
          psVar39 = (secp256k1_gej *)(ulong)uVar1;
          iVar2 = iVar2 - (uint)lVar12;
          psStack_300 = psVar37;
          if (iVar2 == 0) break;
          if (((ulong)psVar33 & 1) == 0) {
            psStack_350 = (secp256k1_gej *)0x149fb1;
            secp256k1_jacobi64_maybe_var_cold_7();
LAB_00149fb1:
            psStack_350 = (secp256k1_gej *)0x149fb6;
            secp256k1_jacobi64_maybe_var_cold_6();
LAB_00149fb6:
            psStack_350 = (secp256k1_gej *)0x149fbb;
            secp256k1_jacobi64_maybe_var_cold_1();
LAB_00149fbb:
            psStack_350 = (secp256k1_gej *)0x149fc0;
            secp256k1_jacobi64_maybe_var_cold_2();
            goto LAB_00149fc0;
          }
          if (((ulong)psVar31 & 1) == 0) goto LAB_00149fb1;
          a_00 = (secp256k1_sha256 *)((long)psVar6 * (long)puVar28 + (long)psVar38 * (long)r_01);
          bVar8 = 0x3e - (char)iVar2;
          psVar24 = (secp256k1_sha256 *)((long)psVar33 << (bVar8 & 0x3f));
          if (a_00 != psVar24) goto LAB_00149fb6;
          psVar24 = (secp256k1_sha256 *)((long)psVar35 * (long)puVar28 + (long)psVar29 * (long)r_01)
          ;
          a_00 = (secp256k1_sha256 *)((long)psVar31 << (bVar8 & 0x3f));
          if (psVar24 != a_00) goto LAB_00149fbb;
          iVar32 = (int)psVar33;
          iVar17 = (int)psVar31;
          if ((long)uVar10 < 0) {
            uVar10 = -uVar10;
            iVar9 = (int)uVar10 + 1;
            if (iVar2 <= iVar9) {
              iVar9 = iVar2;
            }
            a_00 = (secp256k1_sha256 *)(ulong)(iVar9 - 0x3fU);
            if (0xffffffc1 < iVar9 - 0x3fU) {
              psVar20 = (secp256k1_gej *)
                        (ulong)(uVar1 ^ (uint)(((ulong)psVar31 & (ulong)psVar33) >> 1));
              psVar24 = (secp256k1_sha256 *)
                        ((ulong)(0x3fL << (-(char)iVar9 & 0x3fU)) >> (-(char)iVar9 & 0x3fU));
              uVar1 = (iVar17 * iVar17 + 0x3e) * iVar17 * iVar32 & (uint)psVar24;
              psVar7 = psVar6;
              psVar6 = psVar35;
              psVar21 = psVar31;
              a_00 = psVar38;
              psVar38 = psVar29;
              goto LAB_00149d9b;
            }
            goto LAB_00149fca;
          }
          iVar9 = (int)uVar10 + 1;
          if (iVar2 <= iVar9) {
            iVar9 = iVar2;
          }
          a_00 = (secp256k1_sha256 *)(ulong)(iVar9 - 0x3fU);
          if (iVar9 - 0x3fU < 0xffffffc2) goto LAB_00149fc5;
          psVar24 = (secp256k1_sha256 *)
                    ((ulong)(0xfL << (-(char)iVar9 & 0x3fU)) >> (-(char)iVar9 & 0x3fU));
          uVar1 = -(iVar17 * ((iVar32 * 2 + 2U & 8) + iVar32)) & (uint)psVar24;
          psVar7 = psVar35;
          psVar21 = psVar33;
          a_00 = psVar29;
          psVar33 = psVar31;
          psVar20 = psVar39;
LAB_00149d9b:
          uVar5 = (ulong)uVar1;
          puVar30 = (uint64_t *)((long)(psVar33->x).n + uVar5 * (long)psVar21);
          psVar29 = (secp256k1_sha256 *)((long)a_00->s + (long)psVar38 * uVar5);
          psVar35 = (secp256k1_gej *)((long)(psVar7->x).n + uVar5 * (long)psVar6);
          psVar33 = psVar21;
          psVar39 = psVar20;
          if (((ulong)puVar30 & (ulong)psVar24) != 0) {
LAB_00149fc0:
            psStack_350 = (secp256k1_gej *)0x149fc5;
            secp256k1_jacobi64_maybe_var_cold_4();
LAB_00149fc5:
            psStack_350 = (secp256k1_gej *)0x149fca;
            secp256k1_jacobi64_maybe_var_cold_3();
LAB_00149fca:
            psStack_350 = (secp256k1_gej *)0x149fcf;
            secp256k1_jacobi64_maybe_var_cold_5();
            psVar19 = psVar24;
            psVar37 = psVar38;
            goto LAB_00149fcf;
          }
        }
        r_01 = SUB168(SEXT816((long)psVar6) * SEXT816((long)psVar29),8);
        uVar5 = (long)psVar38 * (long)psVar35 - (long)psVar6 * (long)psVar29;
        uVar11 = (SUB168(SEXT816((long)psVar38) * SEXT816((long)psVar35),8) - (long)r_01) -
                 (ulong)((ulong)((long)psVar38 * (long)psVar35) <
                        (ulong)((long)psVar6 * (long)psVar29));
        a_00 = (secp256k1_sha256 *)(~uVar11 | uVar5 ^ 0xc000000000000000);
        psVar20 = (secp256k1_gej *)auStack_338;
        sStack_2d0.u = (int64_t)psVar38;
        sStack_2d0.v = (int64_t)psVar6;
        sStack_2d0.q = (int64_t)psVar29;
        sStack_2d0.r = (int64_t)psVar35;
        if ((a_00 != (secp256k1_sha256 *)0x0) && (uVar5 != 0x4000000000000000 || uVar11 != 0))
        goto LAB_0014a001;
        psVar35 = (secp256k1_gej *)auStack_2f8;
        iVar17 = (int)psVar37;
        psStack_350 = (secp256k1_gej *)0x149e49;
        a_00 = psVar37;
        r_01 = psVar35;
        iVar2 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)psVar35,iVar17,
                           (secp256k1_modinv64_signed62 *)auStack_338._40_8_,0);
        if (iVar2 < 1) {
LAB_00149fcf:
          psStack_350 = (secp256k1_gej *)0x149fd4;
          secp256k1_jacobi64_maybe_var_cold_15();
LAB_00149fd4:
          psStack_350 = (secp256k1_gej *)0x149fd9;
          secp256k1_jacobi64_maybe_var_cold_14();
LAB_00149fd9:
          psStack_350 = (secp256k1_gej *)0x149fde;
          secp256k1_jacobi64_maybe_var_cold_13();
LAB_00149fde:
          psStack_350 = (secp256k1_gej *)0x149fe3;
          secp256k1_jacobi64_maybe_var_cold_12();
          goto LAB_00149fe3;
        }
        psStack_350 = (secp256k1_gej *)0x149e64;
        a_00 = psVar37;
        r_01 = psVar35;
        iVar2 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)psVar35,iVar17,
                           (secp256k1_modinv64_signed62 *)psVar19,1);
        if (0 < iVar2) goto LAB_00149fd4;
        psStack_350 = (secp256k1_gej *)0x149e7c;
        a_00 = psVar37;
        r_01 = psVar20;
        iVar2 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)psVar20,iVar17,
                           (secp256k1_modinv64_signed62 *)psVar19,0);
        if (iVar2 < 1) goto LAB_00149fd9;
        psStack_350 = (secp256k1_gej *)0x149e97;
        a_00 = psVar37;
        r_01 = psVar20;
        iVar2 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)psVar20,iVar17,
                           (secp256k1_modinv64_signed62 *)psVar19,1);
        if (-1 < iVar2) goto LAB_00149fde;
        psStack_350 = (secp256k1_gej *)0x149eb2;
        secp256k1_modinv64_update_fg_62_var
                  (iVar17,(secp256k1_modinv64_signed62 *)psVar35,
                   (secp256k1_modinv64_signed62 *)psVar20,&sStack_2d0);
        if (auStack_2f8._0_8_ == 1) {
          if (1 < iVar17) {
            psVar24 = (secp256k1_sha256 *)0x1;
            uVar5 = 0;
            do {
              uVar5 = uVar5 | *(ulong *)(auStack_2f8 + (long)psVar24 * 8);
              psVar24 = (secp256k1_sha256 *)((long)psVar24->s + 1);
            } while (psVar37 != psVar24);
            if (uVar5 != 0) goto LAB_00149ee4;
          }
          uStack_340._4_4_ = 1 - (uVar1 * 2 & 2);
          bVar40 = false;
        }
        else {
LAB_00149ee4:
          lVar12 = (long)iVar17;
          if ((-1 < lVar12 + -2 && (&psStack_300)[lVar12] == (secp256k1_sha256 *)0x0) &&
              (&uStack_340)[lVar12] == 0) {
            psVar37 = (secp256k1_sha256 *)(ulong)(iVar17 - 1);
          }
          psStack_350 = (secp256k1_gej *)0x149f11;
          iVar17 = (int)psVar37;
          a_00 = psVar37;
          r_01 = psVar35;
          iVar2 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)psVar35,iVar17,
                             (secp256k1_modinv64_signed62 *)psVar19,0);
          if (iVar2 < 1) goto LAB_00149fe8;
          psStack_350 = (secp256k1_gej *)0x149f2c;
          a_00 = psVar37;
          r_01 = psVar35;
          iVar2 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)psVar35,iVar17,
                             (secp256k1_modinv64_signed62 *)psVar19,1);
          if (0 < iVar2) goto LAB_00149fed;
          psStack_350 = (secp256k1_gej *)0x149f44;
          a_00 = psVar37;
          r_01 = psVar20;
          iVar2 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)psVar20,iVar17,
                             (secp256k1_modinv64_signed62 *)psVar19,0);
          if (iVar2 < 1) goto LAB_00149ff2;
          psStack_350 = (secp256k1_gej *)0x149f5f;
          a_00 = psVar37;
          r_01 = psVar20;
          iVar2 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)psVar20,iVar17,
                             (secp256k1_modinv64_signed62 *)psVar19,1);
          bVar40 = true;
          if (-1 < iVar2) goto LAB_00149ff7;
        }
        if ((!bVar40) ||
           (uVar1 = (int)uStack_308 + 1, uStack_308 = (ulong)uVar1, psVar24 = psVar19,
           psVar20 = psVar39, uVar1 == 0xc)) {
          return;
        }
      } while( true );
    }
  }
  psStack_350 = (secp256k1_gej *)0x14a001;
  secp256k1_jacobi64_maybe_var_cold_17();
LAB_0014a001:
  psStack_350 = (secp256k1_gej *)secp256k1_ecmult_const;
  secp256k1_jacobi64_maybe_var_cold_16();
  psStack_378 = psVar24;
  psStack_370 = psVar35;
  uStack_368 = uVar10;
  psStack_360 = psVar38;
  psStack_358 = psVar39;
  psStack_350 = psVar20;
  secp256k1_ge_verify((secp256k1_ge *)a_00);
  if ((int)a_00->bytes != 0) {
    secp256k1_gej_set_infinity(r_01);
    return;
  }
  r_00 = (secp256k1_scalar *)(auStack_10f0 + 0x50);
  secp256k1_scalar_add(r_00,a,&secp256k1_ecmult_const_K);
  secp256k1_scalar_half(r_00,r_00);
  psVar20 = (secp256k1_gej *)(auStack_1180 + 0x70);
  secp256k1_scalar_split_lambda((secp256k1_scalar *)auStack_10f0,(secp256k1_scalar *)psVar20,r_00);
  secp256k1_scalar_add
            ((secp256k1_scalar *)auStack_10f0,(secp256k1_scalar *)auStack_10f0,
             &secp256k1_ecmult_const::S_OFFSET);
  psVar39 = psVar20;
  secp256k1_scalar_add
            ((secp256k1_scalar *)psVar20,(secp256k1_scalar *)psVar20,
             &secp256k1_ecmult_const::S_OFFSET);
  uVar5 = 0x81;
  do {
    psVar35 = (secp256k1_gej *)auStack_10f0;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_10f0);
    if ((*(ulong *)(auStack_10f0 + (uVar5 >> 6) * 8) >> (uVar5 & 0x3f) & 1) != 0) {
      secp256k1_ecmult_const_cold_1();
LAB_0014a4d3:
      secp256k1_ecmult_const_cold_2();
      goto LAB_0014a4d8;
    }
    psVar35 = psVar20;
    secp256k1_scalar_verify((secp256k1_scalar *)psVar20);
    if ((*(ulong *)(auStack_10f0 + (uVar5 >> 6) * 8 + -0x20) >> ((uint)uVar5 & 0x3f) & 1) != 0)
    goto LAB_0014a4d3;
    uVar1 = (uint)uVar5 + 1;
    uVar5 = (ulong)uVar1;
  } while (uVar1 != 0x100);
  secp256k1_gej_set_ge(r_01,(secp256k1_ge *)a_00);
  secp256k1_ecmult_odd_multiples_table
            (0x10,&sStack_a00,&sStack_1080.x,(secp256k1_fe *)(auStack_10f0 + 0x20),r_01);
  secp256k1_ge_table_set_globalz(0x10,&sStack_a00,&sStack_1080.x);
  lVar12 = 0;
  do {
    secp256k1_ge_mul_lambda
              ((secp256k1_ge *)((long)sStack_1080.x.n + lVar12),
               (secp256k1_ge *)((long)sStack_a00.x.n + lVar12));
    lVar12 = lVar12 + 0x68;
  } while (lVar12 != 0x680);
  psVar25 = (secp256k1_fe *)(auStack_1180 + 0x30);
  iVar2 = 0x19;
  while( true ) {
    uVar1 = iVar2 * 5;
    uVar3 = secp256k1_scalar_get_bits_var((secp256k1_scalar *)auStack_10f0,uVar1,5);
    psVar35 = (secp256k1_gej *)(auStack_1180 + 0x70);
    psVar39 = (secp256k1_gej *)(ulong)uVar1;
    uVar4 = secp256k1_scalar_get_bits_var((secp256k1_scalar *)psVar35,uVar1,5);
    uVar1 = uVar3 >> 4 ^ 1;
    if (0x1f < uVar3) break;
    auStack_1180._32_8_ = sStack_a00.x.n[4];
    auStack_1180._40_4_ = sStack_a00.x.magnitude;
    auStack_1180._44_4_ = sStack_a00.x.normalized;
    auStack_1180._16_8_ = sStack_a00.x.n[2];
    auStack_1180._24_8_ = sStack_a00.x.n[3];
    auStack_1180._0_8_ = sStack_a00.x.n[0];
    auStack_1180._8_8_ = sStack_a00.x.n[1];
    auStack_1180._80_8_ = sStack_a00.y.n[4];
    auStack_1180._88_4_ = sStack_a00.y.magnitude;
    auStack_1180._92_4_ = sStack_a00.y.normalized;
    auStack_1180._64_8_ = sStack_a00.y.n[2];
    auStack_1180._72_8_ = sStack_a00.y.n[3];
    auStack_1180._48_8_ = sStack_a00.y.n[0];
    auStack_1180._56_8_ = sStack_a00.y.n[1];
    uVar5 = 1;
    psVar18 = asStack_968;
    do {
      uVar13 = (uint)(((uVar3 ^ -uVar1) & 0xf) == uVar5);
      secp256k1_fe_cmov((secp256k1_fe *)auStack_1180,psVar18 + -1,uVar13);
      secp256k1_fe_cmov(psVar25,psVar18,uVar13);
      uVar5 = uVar5 + 1;
      psVar18 = (secp256k1_fe *)(psVar18[2].n + 1);
    } while (uVar5 != 0x10);
    auStack_1180._96_4_ = 0;
    secp256k1_fe_verify(psVar25);
    secp256k1_fe_verify_magnitude(psVar25,1);
    sStack_11b0.n[0] = 0x3ffffbfffff0bc - auStack_1180._48_8_;
    sStack_11b0.n[1] = 0x3ffffffffffffc - auStack_1180._56_8_;
    sStack_11b0.n[2] = 0x3ffffffffffffc - auStack_1180._64_8_;
    sStack_11b0.n[3] = 0x3ffffffffffffc - auStack_1180._72_8_;
    sStack_11b0.n[4] = 0x3fffffffffffc - auStack_1180._80_8_;
    sStack_11b0.magnitude = 2;
    sStack_11b0.normalized = 0;
    secp256k1_fe_verify(&sStack_11b0);
    secp256k1_fe_cmov(psVar25,&sStack_11b0,uVar1);
    psVar35 = r_01;
    if (iVar2 == 0x19) {
      psVar39 = (secp256k1_gej *)auStack_1180;
      secp256k1_gej_set_ge(r_01,(secp256k1_ge *)auStack_1180);
    }
    else {
      iVar17 = 5;
      do {
        secp256k1_gej_double(r_01,r_01);
        iVar17 = iVar17 + -1;
      } while (iVar17 != 0);
      psVar39 = r_01;
      secp256k1_gej_add_ge(r_01,r_01,(secp256k1_ge *)auStack_1180);
    }
    uVar1 = uVar4 >> 4 ^ 1;
    if (0x1f < uVar4) goto LAB_0014a4dd;
    auStack_1180._32_8_ = sStack_1080.x.n[4];
    auStack_1180._40_4_ = sStack_1080.x.magnitude;
    auStack_1180._44_4_ = sStack_1080.x.normalized;
    auStack_1180._16_8_ = sStack_1080.x.n[2];
    auStack_1180._24_8_ = sStack_1080.x.n[3];
    auStack_1180._0_8_ = sStack_1080.x.n[0];
    auStack_1180._8_8_ = sStack_1080.x.n[1];
    auStack_1180._80_8_ = sStack_1080.y.n[4];
    auStack_1180._88_4_ = sStack_1080.y.magnitude;
    auStack_1180._92_4_ = sStack_1080.y.normalized;
    auStack_1180._64_8_ = sStack_1080.y.n[2];
    auStack_1180._72_8_ = sStack_1080.y.n[3];
    auStack_1180._48_8_ = sStack_1080.y.n[0];
    auStack_1180._56_8_ = sStack_1080.y.n[1];
    uVar5 = 1;
    psVar18 = asStack_fe8;
    do {
      uVar13 = (uint)(((uVar4 ^ -uVar1) & 0xf) == uVar5);
      secp256k1_fe_cmov((secp256k1_fe *)auStack_1180,psVar18 + -1,uVar13);
      secp256k1_fe_cmov(psVar25,psVar18,uVar13);
      uVar5 = uVar5 + 1;
      psVar18 = (secp256k1_fe *)(psVar18[2].n + 1);
    } while (uVar5 != 0x10);
    auStack_1180._96_4_ = 0;
    secp256k1_fe_verify(psVar25);
    secp256k1_fe_verify_magnitude(psVar25,1);
    sStack_11b0.n[0] = 0x3ffffbfffff0bc - auStack_1180._48_8_;
    sStack_11b0.n[1] = 0x3ffffffffffffc - auStack_1180._56_8_;
    sStack_11b0.n[2] = 0x3ffffffffffffc - auStack_1180._64_8_;
    sStack_11b0.n[3] = 0x3ffffffffffffc - auStack_1180._72_8_;
    sStack_11b0.n[4] = 0x3fffffffffffc - auStack_1180._80_8_;
    sStack_11b0.magnitude = 2;
    sStack_11b0.normalized = 0;
    secp256k1_fe_verify(&sStack_11b0);
    secp256k1_fe_cmov(psVar25,&sStack_11b0,uVar1);
    secp256k1_gej_add_ge(r_01,r_01,(secp256k1_ge *)auStack_1180);
    bVar40 = iVar2 == 0;
    iVar2 = iVar2 + -1;
    if (bVar40) {
      secp256k1_fe_mul(&r_01->z,&r_01->z,(secp256k1_fe *)(auStack_10f0 + 0x20));
      return;
    }
  }
LAB_0014a4d8:
  secp256k1_ecmult_const_cold_4();
LAB_0014a4dd:
  secp256k1_ecmult_const_cold_3();
  secp256k1_ge_verify((secp256k1_ge *)psVar39);
  psVar20 = psVar35;
  for (lVar12 = 0xd; lVar12 != 0; lVar12 = lVar12 + -1) {
    (psVar20->x).n[0] = (psVar39->x).n[0];
    psVar39 = (secp256k1_gej *)((long)psVar39 + (ulong)bVar41 * -0x10 + 8);
    psVar20 = (secp256k1_gej *)((long)psVar20 + (ulong)bVar41 * -0x10 + 8);
  }
  secp256k1_fe_mul(&psVar35->x,&psVar35->x,&secp256k1_const_beta);
  secp256k1_ge_verify((secp256k1_ge *)psVar35);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_inv_var(secp256k1_fe *r, const secp256k1_fe *x) {
    int input_is_zero = secp256k1_fe_normalizes_to_zero(x);
    SECP256K1_FE_VERIFY(x);

    secp256k1_fe_impl_inv_var(r, x);
    r->magnitude = x->magnitude > 0;
    r->normalized = 1;

    VERIFY_CHECK(secp256k1_fe_normalizes_to_zero(r) == input_is_zero);
    SECP256K1_FE_VERIFY(r);
}